

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O1

void __thiscall senjo::UCIAdapter::MoveCommand(UCIAdapter *this,char *params)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *move;
  Output local_40;
  char *local_38;
  
  iVar3 = (*this->engine->_vptr_ChessEngine[8])();
  if ((char)iVar3 == '\0') {
    (*this->engine->_vptr_ChessEngine[7])();
  }
  (this->lastPosition)._M_string_length = 0;
  *(this->lastPosition)._M_dataplus._M_p = '\0';
  if (params == (char *)0x0) {
    return;
  }
  do {
    if (params != (char *)0x0) {
      cVar1 = *params;
      while ((cVar1 != '\0' && (iVar3 = isspace((int)cVar1), iVar3 != 0))) {
        cVar1 = params[1];
        params = params + 1;
      }
    }
    if (*params == '\0') {
      return;
    }
    local_38 = params;
    bVar2 = IsMove(params);
    if (bVar2) {
      iVar3 = (*this->engine->_vptr_ChessEngine[10])(this->engine,params);
      params = (char *)CONCAT44(extraout_var,iVar3);
      if (params == (char *)0x0) goto LAB_00136bc7;
      if (ChessEngine::_debug == '\x01') {
        (*this->engine->_vptr_ChessEngine[0xc])();
      }
      bVar2 = false;
    }
    else {
LAB_00136bc7:
      Output::Output(&local_40,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Invalid move: ",0xe)
      ;
      Output::operator<<(&local_40,&local_38);
      Output::~Output(&local_40);
      bVar2 = true;
    }
    if (bVar2) {
      return;
    }
    if (params == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void UCIAdapter::MoveCommand(const char* params)
{
  if (!engine->IsInitialized()) {
    engine->Initialize();
  }
  lastPosition.clear();
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move) || !(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      return;
    }
    if (engine->IsDebugOn()) {
      engine->PrintBoard();
    }
  }
}